

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

void __thiscall
QFontEngineMulti::QFontEngineMulti
          (QFontEngineMulti *this,QFontEngine *engine,int script,QStringList *fallbackFamilies)

{
  pointer ppQVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QFontEngine::QFontEngine(&this->super_QFontEngine,Multi);
  (this->super_QFontEngine)._vptr_QFontEngine = (_func_int **)&PTR__QFontEngineMulti_00785bd8;
  (this->m_engines).d.d = (Data *)0x0;
  (this->m_engines).d.ptr = (QFontEngine **)0x0;
  (this->m_engines).d.size = 0;
  QArrayDataPointer<QString>::QArrayDataPointer(&(this->m_fallbackFamilies).d,&fallbackFamilies->d);
  this->m_script = script;
  lVar2 = (this->m_fallbackFamilies).d.size;
  this->m_fallbackFamiliesQueried = lVar2 != 0;
  if (lVar2 == 0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    QList<QString>::emplaceBack<QString>(&this->m_fallbackFamilies,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    lVar2 = (this->m_fallbackFamilies).d.size;
  }
  QList<QFontEngine_*>::resize(&this->m_engines,lVar2 + 1);
  LOCK();
  (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  ppQVar1 = QList<QFontEngine_*>::data(&this->m_engines);
  *ppQVar1 = engine;
  QFontDef::operator=(&(this->super_QFontEngine).fontDef,&engine->fontDef);
  (this->super_QFontEngine).cache_cost = engine->cache_cost;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngineMulti::QFontEngineMulti(QFontEngine *engine, int script, const QStringList &fallbackFamilies)
    : QFontEngine(Multi),
      m_fallbackFamilies(fallbackFamilies),
      m_script(script),
      m_fallbackFamiliesQueried(!m_fallbackFamilies.isEmpty())
{
    Q_ASSERT(engine && engine->type() != QFontEngine::Multi);

    if (m_fallbackFamilies.isEmpty()) {
        // defer obtaining the fallback families until loadEngine(1)
        m_fallbackFamilies << QString();
    }

    m_engines.resize(m_fallbackFamilies.size() + 1);

    engine->ref.ref();
    m_engines[0] = engine;

    fontDef = engine->fontDef;
    cache_cost = engine->cache_cost;
}